

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void hexFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  byte bVar1;
  int iVar2;
  void *pvVar3;
  char *z;
  long lVar4;
  char *pcVar5;
  long lVar6;
  
  pvVar3 = sqlite3_value_blob(*argv);
  iVar2 = sqlite3ValueBytes(*argv,'\x01');
  z = (char *)contextMalloc(context,(long)iVar2 * 2 + 1);
  if (z != (char *)0x0) {
    pcVar5 = z;
    if (0 < iVar2) {
      lVar4 = 0;
      lVar6 = 0;
      do {
        bVar1 = *(byte *)((long)pvVar3 + lVar6);
        z[lVar6 * 2] = "0123456789ABCDEF"[bVar1 >> 4];
        z[lVar6 * 2 + 1] = "0123456789ABCDEF"[bVar1 & 0xf];
        lVar6 = lVar6 + 1;
        lVar4 = lVar4 + -2;
      } while (iVar2 != (int)lVar6);
      pcVar5 = z + -lVar4;
    }
    *pcVar5 = '\0';
    sqlite3_result_text64(context,z,(long)pcVar5 - (long)z,sqlite3_free,'\x01');
    return;
  }
  return;
}

Assistant:

static void hexFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  int i, n;
  const unsigned char *pBlob;
  char *zHex, *z;
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  pBlob = sqlite3_value_blob(argv[0]);
  n = sqlite3_value_bytes(argv[0]);
  assert( pBlob==sqlite3_value_blob(argv[0]) );  /* No encoding change */
  z = zHex = contextMalloc(context, ((i64)n)*2 + 1);
  if( zHex ){
    for(i=0; i<n; i++, pBlob++){
      unsigned char c = *pBlob;
      *(z++) = hexdigits[(c>>4)&0xf];
      *(z++) = hexdigits[c&0xf];
    }
    *z = 0;
    sqlite3_result_text64(context, zHex, (u64)(z-zHex),
                          sqlite3_free, SQLITE_UTF8);
  }
}